

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_portable.c
# Opt level: O0

void blake3_compress_in_place_portable
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags)

{
  uint8_t *p_15;
  uint8_t *p_14;
  uint8_t *p_13;
  uint8_t *p_12;
  uint8_t *p_11;
  uint8_t *p_10;
  uint8_t *p_9;
  uint8_t *p_8;
  uint8_t *p_7;
  uint8_t *p_6;
  uint8_t *p_5;
  uint8_t *p_4;
  uint8_t *p_3;
  uint8_t *p_2;
  uint8_t *p_1;
  uint8_t *p;
  uint8_t *schedule_6;
  uint8_t *schedule_5;
  uint8_t *schedule_4;
  uint8_t *schedule_3;
  uint8_t *schedule_2;
  uint8_t *schedule_1;
  uint8_t *schedule;
  uint local_1428;
  uint local_1424;
  uint32_t state [16];
  uint8_t flags_local;
  uint64_t counter_local;
  uint8_t block_len_local;
  uint8_t *block_local;
  uint32_t *cv_local;
  
  local_1424 = (uint)(counter >> 0x20);
  local_1428 = (uint)counter;
  *cv = *cv ^ 0x6a09e667;
  cv[1] = cv[1] ^ 0xbb67ae85;
  cv[2] = cv[2] ^ 0x3c6ef372;
  cv[3] = cv[3] ^ 0xa54ff53a;
  cv[4] = cv[4] ^ local_1428;
  cv[5] = cv[5] ^ local_1424;
  cv[6] = cv[6] ^ (uint)block_len;
  cv[7] = cv[7] ^ (uint)flags;
  return;
}

Assistant:

void blake3_compress_in_place_portable(uint32_t cv[8],
                                       const uint8_t block[BLAKE3_BLOCK_LEN],
                                       uint8_t block_len, uint64_t counter,
                                       uint8_t flags) {
  uint32_t state[16];
  compress_pre(state, cv, block, block_len, counter, flags);
  cv[0] = state[0] ^ state[8];
  cv[1] = state[1] ^ state[9];
  cv[2] = state[2] ^ state[10];
  cv[3] = state[3] ^ state[11];
  cv[4] = state[4] ^ state[12];
  cv[5] = state[5] ^ state[13];
  cv[6] = state[6] ^ state[14];
  cv[7] = state[7] ^ state[15];
}